

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day19.cpp
# Opt level: O0

void day19(input_t input)

{
  uint32_t *puVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  uint32_t uVar5;
  value_type vVar6;
  uint32_t uVar7;
  reference pvVar8;
  iterator pvVar9;
  uint *puVar10;
  vector<std::array<signed_char,_4UL>,_std::allocator<std::array<signed_char,_4UL>_>_> *pvVar11;
  byte *pbVar12;
  reference pvVar13;
  long lVar14;
  char *pcVar15;
  long in_RSI;
  char *in_RDI;
  uint32_t *Rc;
  uint32_t Rb;
  uint32_t Ra;
  value_type Ic;
  value_type Ib;
  value_type Ia;
  value_type *O;
  uint32_t *ip;
  uint32_t R [8];
  value_type_conflict1 *P;
  iterator __end1;
  iterator __begin1;
  array<unsigned_int,_2UL> *__range1;
  array<unsigned_int,_2UL> part;
  uint8_t c_1;
  int i;
  int n;
  int have;
  Quad tmp;
  vector<std::array<signed_char,_4UL>,_std::allocator<std::array<signed_char,_4UL>_>_> V;
  uint8_t c;
  int8_t ipreg;
  size_type in_stack_ffffffffffffff08;
  undefined8 *__n;
  uint in_stack_ffffffffffffff10;
  value_type_conflict1 vVar16;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 uVar17;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  vector<std::array<signed_char,_4UL>,_std::allocator<std::array<signed_char,_4UL>_>_>
  *in_stack_ffffffffffffff20;
  uint32_t local_a8 [3];
  uint32_t in_stack_ffffffffffffff64;
  uint32_t *local_70;
  undefined8 local_5c [3];
  byte local_41;
  int local_40;
  int local_3c;
  int local_38;
  vector<std::array<signed_char,_4UL>,_std::allocator<std::array<signed_char,_4UL>_>_> local_30;
  byte local_12;
  byte local_11;
  char *local_10;
  long local_8;
  
  local_11 = 0xff;
  local_10 = in_RDI;
  local_8 = in_RSI;
  do {
    lVar14 = local_8 + -1;
    bVar2 = local_11;
    if (local_8 == 0) break;
    pcVar15 = local_10 + 1;
    local_12 = *local_10 - 0x30;
    bVar2 = local_12;
    local_10 = pcVar15;
    local_8 = lVar14;
  } while (5 < local_12);
  local_11 = bVar2;
  if (local_11 == 0xff) {
    local_8 = lVar14;
    abort();
  }
  local_8 = lVar14;
  std::vector<std::array<signed_char,_4UL>,_std::allocator<std::array<signed_char,_4UL>_>_>::vector
            ((vector<std::array<signed_char,_4UL>,_std::allocator<std::array<signed_char,_4UL>_>_> *
             )0x1405de);
  local_38 = 0;
  local_3c = 0;
  local_40 = 0;
  while (lVar14 = local_8 + -1, local_8 != 0) {
    local_41 = *local_10 - 0x30;
    if (local_41 < 100) {
      local_38 = 1;
      local_3c = local_3c * 10 + (uint)local_41;
      local_8 = lVar14;
    }
    else {
      local_8 = lVar14;
      if (local_38 != 0) {
        vVar6 = (value_type)local_3c;
        pvVar8 = std::array<signed_char,_4UL>::operator[]
                           ((array<signed_char,_4UL> *)
                            CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                            in_stack_ffffffffffffff08);
        *pvVar8 = vVar6;
        local_38 = 0;
        local_3c = 0;
        local_40 = local_40 + 1;
        if (local_40 == 4) {
          local_40 = 0;
          std::vector<std::array<signed_char,_4UL>,_std::allocator<std::array<signed_char,_4UL>_>_>
          ::push_back(in_stack_ffffffffffffff20,
                      (value_type *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        }
      }
    }
    local_10 = local_10 + 1;
  }
  local_5c[0] = 0x100000000;
  local_8 = lVar14;
  local_70 = std::array<unsigned_int,_2UL>::begin((array<unsigned_int,_2UL> *)0x140760);
  pvVar9 = std::array<unsigned_int,_2UL>::end((array<unsigned_int,_2UL> *)0x140775);
  do {
    if (local_70 == pvVar9) {
      uVar17 = 0;
      __n = local_5c;
      pvVar13 = std::array<unsigned_int,_2UL>::operator[]
                          ((array<unsigned_int,_2UL> *)(ulong)in_stack_ffffffffffffff10,
                           (size_type)__n);
      vVar16 = *pvVar13;
      pvVar13 = std::array<unsigned_int,_2UL>::operator[]
                          ((array<unsigned_int,_2UL> *)CONCAT44(uVar17,vVar16),(size_type)__n);
      printf("Day 19 Part 1: %u\nDay 19 Part 2: %u\n",(ulong)vVar16,(ulong)*pvVar13);
      std::vector<std::array<signed_char,_4UL>,_std::allocator<std::array<signed_char,_4UL>_>_>::
      ~vector(in_stack_ffffffffffffff20);
      return;
    }
    memset(local_a8,0,0x20);
    local_a8[0] = *local_70;
    puVar10 = local_a8 + (char)local_11;
    while( true ) {
      in_stack_ffffffffffffff20 =
           (vector<std::array<signed_char,_4UL>,_std::allocator<std::array<signed_char,_4UL>_>_> *)
           (ulong)*puVar10;
      pvVar11 = (vector<std::array<signed_char,_4UL>,_std::allocator<std::array<signed_char,_4UL>_>_>
                 *)std::
                   vector<std::array<signed_char,_4UL>,_std::allocator<std::array<signed_char,_4UL>_>_>
                   ::size(&local_30);
      if (pvVar11 <= in_stack_ffffffffffffff20) break;
      std::vector<std::array<signed_char,_4UL>,_std::allocator<std::array<signed_char,_4UL>_>_>::
      operator[](&local_30,(ulong)*puVar10);
      pbVar12 = (byte *)std::array<signed_char,_4UL>::operator[]
                                  ((array<signed_char,_4UL> *)
                                   CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                                   in_stack_ffffffffffffff08);
      bVar2 = *pbVar12;
      pbVar12 = (byte *)std::array<signed_char,_4UL>::operator[]
                                  ((array<signed_char,_4UL> *)
                                   CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                                   in_stack_ffffffffffffff08);
      bVar3 = *pbVar12;
      pbVar12 = (byte *)std::array<signed_char,_4UL>::operator[]
                                  ((array<signed_char,_4UL> *)
                                   CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                                   in_stack_ffffffffffffff08);
      uVar7 = local_a8[bVar2 & 7];
      uVar5 = local_a8[bVar3 & 7];
      puVar1 = local_a8 + (*pbVar12 & 7);
      pvVar8 = std::array<signed_char,_4UL>::operator[]
                         ((array<signed_char,_4UL> *)
                          CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                          in_stack_ffffffffffffff08);
      cVar4 = *pvVar8;
      if (cVar4 == -0x33) {
        *puVar1 = uVar7 * (int)(char)bVar3;
      }
      else if (cVar4 == -0x2a) {
        *puVar1 = uVar7 * uVar5;
      }
      else if (cVar4 == -7) {
        *puVar1 = uVar7 + (int)(char)bVar3;
      }
      else if (cVar4 == '\x02') {
        *puVar1 = uVar7 + uVar5;
      }
      else {
        if (cVar4 == 'B') {
          *local_70 = uVar5;
          break;
        }
        if (cVar4 == 'M') {
          *puVar1 = (int)(char)bVar2;
        }
        else {
          if (cVar4 != 'V') {
            abort();
          }
          *puVar1 = uVar7;
        }
      }
      *puVar10 = *puVar10 + 1;
    }
    uVar7 = divisor_sum(in_stack_ffffffffffffff64);
    *local_70 = uVar7;
    local_70 = local_70 + 1;
  } while( true );
}

Assistant:

void day19(input_t input) {
	int8_t ipreg = -1;

	while (input.len--) {
		uint8_t c = *input.s++ - '0';
		if (c < 6) {
			ipreg = c;
			break;
		}
	}
	if (ipreg == -1) {
		abort();
	}

	std::vector<Quad> V;
	Quad tmp;
	for (int have = 0, n = 0, i = 0; input.len--; input.s++) {
		uint8_t c = *input.s - '0';
		if (c < 100) {
			have = 1;
			n = 10 * n + c;
		} else if (have) {
			tmp[i] = n;
			n = have = 0;
			if (++i == 4) {
				i = 0;
				V.push_back(tmp);
			}
		}
	}

	std::array<uint32_t, 2> part = { 0, 1 };
	for (auto&& P : part) {
		uint32_t R[8] = { P };
		for (auto &ip = R[ipreg]; ip < V.size(); ip++) {
			auto &O = V[ip];
			auto Ia = O[1],    Ib = O[2],     Ic = O[3];
			auto Ra = R[Ia&7], Rb = R[Ib&7], &Rc = R[Ic&7];
			switch (O[0]) {
			    case  -7: Rc = Ra + Ib;    break;     // addi
			    case   2: Rc = Ra + Rb;    break;     // addr
			    case  66: P  = Rb;         goto done; // eqrr
			    case -51: Rc = Ra * Ib;    break;     // muli
			    case -42: Rc = Ra * Rb;    break;     // mulr
			    case  77: Rc = Ia;         break;     // seti
			    case  86: Rc = Ra;         break;     // setr
			    default: abort();
			}
		}
done:
		P = divisor_sum(P);
	}

	printf("Day 19 Part 1: %u\nDay 19 Part 2: %u\n", part[0], part[1]);
}